

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPServer.cpp
# Opt level: O0

ssize_t __thiscall
SocketPP::TCPServer::send(TCPServer *this,int __fd,void *__buf,size_t __n,int __flags)

{
  uint uVar1;
  bool bVar2;
  char *pcVar3;
  size_t __n_00;
  reference this_00;
  RawMsg *this_01;
  byte *pbVar4;
  void *__buf_00;
  undefined4 in_register_00000034;
  char *local_138;
  char *local_130;
  char *local_128;
  char *local_120;
  char *local_f8;
  char *local_f0;
  char *local_e8;
  char *local_e0;
  char *local_a0;
  char *local_98;
  char *local_90;
  char *local_88;
  ssize_t ret;
  RawMsg *rawMsg;
  TCPStream *stream;
  TCPStream *local_58;
  __normal_iterator<const_SocketPP::TCPStream_*,_std::vector<SocketPP::TCPStream,_std::allocator<SocketPP::TCPStream>_>_>
  local_50;
  __normal_iterator<const_SocketPP::TCPStream_*,_std::vector<SocketPP::TCPStream,_std::allocator<SocketPP::TCPStream>_>_>
  local_48;
  __normal_iterator<const_SocketPP::TCPStream_*,_std::vector<SocketPP::TCPStream,_std::allocator<SocketPP::TCPStream>_>_>
  *local_40;
  __normal_iterator<const_SocketPP::TCPStream_*,_std::vector<SocketPP::TCPStream,_std::allocator<SocketPP::TCPStream>_>_>
  *iter;
  lock_guard<std::mutex> local_28;
  lock_guard<std::mutex> lockStream;
  Message *message_local;
  TCPServer *this_local;
  
  lockStream._M_device = (mutex_type *)CONCAT44(in_register_00000034,__fd);
  if (((this->super_SocketServer).super_Socket.field_0xc & 1) == 0) {
    pcVar3 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/TCPServer.cpp"
                     ,0x2f);
    if (pcVar3 == (char *)0x0) {
      pcVar3 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/TCPServer.cpp"
                       ,0x5c);
      if (pcVar3 == (char *)0x0) {
        local_90 = 
        "/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/TCPServer.cpp"
        ;
      }
      else {
        local_90 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/TCPServer.cpp"
                           ,0x5c);
        local_90 = local_90 + 1;
      }
      local_88 = local_90;
    }
    else {
      local_88 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/TCPServer.cpp"
                         ,0x2f);
      local_88 = local_88 + 1;
    }
    printf("\x1b[31mERROR: %s: %s: %d: not inited!\x1b[m\n",local_88,"send",0x1b);
    this_local = (TCPServer *)0xfffffffffffffffe;
  }
  else {
    std::lock_guard<std::mutex>::lock_guard(&local_28,&this->streamMutex_);
    pcVar3 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/TCPServer.cpp"
                     ,0x2f);
    if (pcVar3 == (char *)0x0) {
      pcVar3 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/TCPServer.cpp"
                       ,0x5c);
      if (pcVar3 == (char *)0x0) {
        local_a0 = 
        "/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/TCPServer.cpp"
        ;
      }
      else {
        local_a0 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/TCPServer.cpp"
                           ,0x5c);
        local_a0 = local_a0 + 1;
      }
      local_98 = local_a0;
    }
    else {
      local_98 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/TCPServer.cpp"
                         ,0x2f);
      local_98 = local_98 + 1;
    }
    uVar1 = ((lockStream._M_device)->super___mutex_base)._M_mutex.__data.__lock;
    __n_00 = RawMsg::length((RawMsg *)
                            ((long)&((lockStream._M_device)->super___mutex_base)._M_mutex + 8));
    printf("\x1b[33m%s: TCPServer::send: target=%d, len=%ld\x1b[m\n",local_98,(ulong)uVar1);
    bVar2 = std::function::operator_cast_to_bool((function *)&this->sendInterceptor_);
    if ((bVar2) &&
       (bVar2 = std::function<bool_(const_SocketPP::Message_&)>::operator()
                          (&this->sendInterceptor_,(Message *)lockStream._M_device), bVar2)) {
      this_local = (TCPServer *)0x0;
    }
    else {
      local_50._M_current =
           (TCPStream *)
           std::vector<SocketPP::TCPStream,_std::allocator<SocketPP::TCPStream>_>::cbegin
                     (&this->connectedStreams_);
      local_58 = (TCPStream *)
                 std::vector<SocketPP::TCPStream,_std::allocator<SocketPP::TCPStream>_>::cend
                           (&this->connectedStreams_);
      local_48 = std::
                 find<__gnu_cxx::__normal_iterator<SocketPP::TCPStream_const*,std::vector<SocketPP::TCPStream,std::allocator<SocketPP::TCPStream>>>,SocketPP::TCPStream>
                           (local_50,(__normal_iterator<const_SocketPP::TCPStream_*,_std::vector<SocketPP::TCPStream,_std::allocator<SocketPP::TCPStream>_>_>
                                      )local_58,(TCPStream *)lockStream._M_device);
      local_40 = &local_48;
      stream = (TCPStream *)
               std::vector<SocketPP::TCPStream,_std::allocator<SocketPP::TCPStream>_>::cend
                         (&this->connectedStreams_);
      bVar2 = __gnu_cxx::operator==
                        (&local_48,
                         (__normal_iterator<const_SocketPP::TCPStream_*,_std::vector<SocketPP::TCPStream,_std::allocator<SocketPP::TCPStream>_>_>
                          *)&stream);
      if (bVar2) {
        pcVar3 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/TCPServer.cpp"
                         ,0x2f);
        if (pcVar3 == (char *)0x0) {
          pcVar3 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/TCPServer.cpp"
                           ,0x5c);
          if (pcVar3 == (char *)0x0) {
            local_e8 = 
            "/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/TCPServer.cpp"
            ;
          }
          else {
            local_e8 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/TCPServer.cpp"
                               ,0x5c);
            local_e8 = local_e8 + 1;
          }
          local_e0 = local_e8;
        }
        else {
          local_e0 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/TCPServer.cpp"
                             ,0x2f);
          local_e0 = local_e0 + 1;
        }
        printf("\x1b[31mERROR: %s: %s: %d: StreamNotFound\x1b[m\n",local_e0,"send",0x28);
        this_local = (TCPServer *)0xfffffffffffffffd;
      }
      else {
        this_00 = __gnu_cxx::
                  __normal_iterator<const_SocketPP::TCPStream_*,_std::vector<SocketPP::TCPStream,_std::allocator<SocketPP::TCPStream>_>_>
                  ::operator*(local_40);
        onSend(this,this_00,(Message *)lockStream._M_device);
        pcVar3 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/TCPServer.cpp"
                         ,0x2f);
        if (pcVar3 == (char *)0x0) {
          pcVar3 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/TCPServer.cpp"
                           ,0x5c);
          if (pcVar3 == (char *)0x0) {
            local_f8 = 
            "/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/TCPServer.cpp"
            ;
          }
          else {
            local_f8 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/TCPServer.cpp"
                               ,0x5c);
            local_f8 = local_f8 + 1;
          }
          local_f0 = local_f8;
        }
        else {
          local_f0 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/TCPServer.cpp"
                             ,0x2f);
          local_f0 = local_f0 + 1;
        }
        printf("\x1b[33m%s: try to send to stream:%d\x1b[m\n",local_f0,(ulong)(uint)this_00->fd);
        this_01 = (RawMsg *)((long)&((lockStream._M_device)->super___mutex_base)._M_mutex + 8);
        pbVar4 = RawMsg::data(this_01);
        __buf_00 = (void *)RawMsg::length(this_01);
        this_local = (TCPServer *)TCPStream::send(this_00,(int)pbVar4,__buf_00,__n_00,__flags);
        if (this_local == (TCPServer *)0xffffffffffffffff) {
          pcVar3 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/TCPServer.cpp"
                           ,0x2f);
          if (pcVar3 == (char *)0x0) {
            pcVar3 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/TCPServer.cpp"
                             ,0x5c);
            if (pcVar3 == (char *)0x0) {
              local_128 = 
              "/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/TCPServer.cpp"
              ;
            }
            else {
              local_128 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/TCPServer.cpp"
                                  ,0x5c);
              local_128 = local_128 + 1;
            }
            local_120 = local_128;
          }
          else {
            local_120 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/TCPServer.cpp"
                                ,0x2f);
            local_120 = local_120 + 1;
          }
          printf("\x1b[31mERROR: %s: %s: %d: send failed!\x1b[m\n",local_120,"send",0x34);
        }
        else {
          pcVar3 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/TCPServer.cpp"
                           ,0x2f);
          if (pcVar3 == (char *)0x0) {
            pcVar3 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/TCPServer.cpp"
                             ,0x5c);
            if (pcVar3 == (char *)0x0) {
              local_138 = 
              "/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/TCPServer.cpp"
              ;
            }
            else {
              local_138 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/TCPServer.cpp"
                                  ,0x5c);
              local_138 = local_138 + 1;
            }
            local_130 = local_138;
          }
          else {
            local_130 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/TCPServer.cpp"
                                ,0x2f);
            local_130 = local_130 + 1;
          }
          printf("\x1b[33m%s: send success! len:%ld\x1b[m\n",local_130,this_local);
        }
      }
    }
    iter._0_4_ = 1;
    std::lock_guard<std::mutex>::~lock_guard(&local_28);
  }
  return (ssize_t)this_local;
}

Assistant:

ssize_t TCPServer::send(const Message& message) {
    if (!started_) {
        LOGE("not inited!");
        return SendResult::SocketNotInited;
    }

    std::lock_guard<std::mutex> lockStream(streamMutex_);
    LOGD("TCPServer::send: target=%d, len=%ld", message.target.fd, message.rawMsg.length());

    if (sendInterceptor_) {
        if (sendInterceptor_(message)) return SendResult::Intercepted;
    }

    const auto& iter = std::find(connectedStreams_.cbegin(), connectedStreams_.cend(), message.target);
    if (iter == connectedStreams_.cend()) {
        LOGE("StreamNotFound");
        return StreamNotFound;
    }

    const auto& stream = *iter;
    onSend(stream, message);

    LOGD("try to send to stream:%d", stream.fd);
    const auto& rawMsg = message.rawMsg;
    ssize_t ret = stream.send(rawMsg.data(), rawMsg.length());

    if (ret == -1) {
        LOGE("send failed!");
    } else {
        LOGD("send success! len:%ld", ret);
    }

    return ret;
}